

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_oid(uchar **p,uchar *start,char *oid,size_t oid_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t len;
  uchar *puVar4;
  
  len = 0xffffff94;
  if ((long)(int)oid_len <= (long)*p - (long)start) {
    puVar4 = *p + -oid_len;
    *p = puVar4;
    memcpy(puVar4,oid,oid_len);
    len = oid_len & 0xffffffff;
  }
  iVar3 = (int)len;
  iVar2 = iVar3;
  if ((-1 < iVar3) && (iVar1 = mbedtls_asn1_write_len(p,start,len), iVar2 = iVar1, -1 < iVar1)) {
    puVar4 = *p;
    if ((long)puVar4 - (long)start < 1) {
      iVar2 = -0x6c;
    }
    else {
      *p = puVar4 + -1;
      puVar4[-1] = '\x06';
      iVar2 = 1;
    }
    if (puVar4 != start && -1 < (long)puVar4 - (long)start) {
      iVar2 = iVar1 + iVar3 + iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_oid( unsigned char **p, unsigned char *start,
                    const char *oid, size_t oid_len )
{
    int ret;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                                  (const unsigned char *) oid, oid_len ) );
    MBEDTLS_ASN1_CHK_ADD( len , mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len , mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_OID ) );

    return( (int) len );
}